

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int lua_checkmemory(lua_State *L)

{
  byte bVar1;
  global_State *g;
  lu_mem lVar2;
  lu_mem lVar3;
  lu_mem lVar4;
  lu_mem lVar5;
  GCObject *pGVar6;
  lu_mem lVar7;
  char *pcVar8;
  lu_mem local_28;
  
  g = L->l_G;
  bVar1 = g->gcstate;
  if (bVar1 < 3) {
    if ((g->mainthread->marked & 0x18) != 0) {
      __assert_fail("!(((g->mainthread)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x209,"int lua_checkmemory(lua_State *)");
    }
    if (-1 < (short)(g->l_registry).tt_) {
      pcVar8 = "(((&g->l_registry)->tt_) & (1 << 15))";
LAB_0014bda5:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x20a,"int lua_checkmemory(lua_State *)");
    }
    if ((((g->l_registry).value_.gc)->marked & 0x18) != 0) {
      pcVar8 = 
      "!((((((void) sizeof (((((&g->l_registry)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((&g->l_registry)->tt_) & (1 << 15))) ; else __assert_fail (\"(((&g->l_registry)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c\", 522, __extension__ __PRETTY_FUNCTION__); })), (((&g->l_registry)->value_).gc)))->marked) & (((1<<(3)) | (1<<(4)))))"
      ;
      goto LAB_0014bda5;
    }
  }
  else if (-1 < (short)(g->l_registry).tt_) {
    pcVar8 = "(((&g->l_registry)->tt_) & (1 << 15))";
    goto LAB_0014bd86;
  }
  if ((((g->l_registry).value_.gc)->marked & (g->currentwhite ^ 0x18)) != 0) {
    pcVar8 = 
    "!((((((void) sizeof (((((&g->l_registry)->tt_) & (1 << 15))) ? 1 : 0), __extension__ ({ if ((((&g->l_registry)->tt_) & (1 << 15))) ; else __assert_fail (\"(((&g->l_registry)->tt_) & (1 << 15))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c\", 524, __extension__ __PRETTY_FUNCTION__); })), (((&g->l_registry)->value_).gc)))->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
    ;
LAB_0014bd86:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x20c,"int lua_checkmemory(lua_State *)");
  }
  if (g->sweepgc == (GCObject **)0x0) {
    if (bVar1 < 3) {
      lVar2 = checkgraylist(g,g->gray);
      lVar7 = checkgraylist(g,g->grayagain);
      lVar3 = checkgraylist(g,g->weak);
      lVar4 = checkgraylist(g,g->allweak);
      lVar5 = checkgraylist(g,g->ephemeron);
      lVar2 = (lu_mem)((int)lVar5 + (int)lVar4 + (int)lVar3 + (int)lVar7 + (int)lVar2);
      goto LAB_0014bbea;
    }
  }
  else if (3 < (byte)(bVar1 - 3)) {
    __assert_fail("g->sweepgc == ((void*)0) || (3 <= (g)->gcstate && (g)->gcstate <= 6)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x20d,"int lua_checkmemory(lua_State *)");
  }
  lVar2 = 0;
LAB_0014bbea:
  pGVar6 = (GCObject *)&g->fixedgc;
  while (pGVar6 = pGVar6->next, pGVar6 != (GCObject *)0x0) {
    if ((pGVar6->tt != '\x04') || ((pGVar6->marked & 0x3f) != 4)) {
      __assert_fail("o->tt == ((4) | ((0) << 4)) && (!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5))))) && ((o)->marked & 7) == 4"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x212,"int lua_checkmemory(lua_State *)");
    }
  }
  lVar7 = checklist(g,(uint)(g->gcstate == '\x03'),0,g->allgc,g->survival,g->old1,g->reallyold);
  local_28 = checklist(g,0,1,g->finobj,g->finobjsur,g->finobjold1,g->finobjrold);
  local_28 = local_28 + lVar7;
  pGVar6 = g->tobefnz;
  if (pGVar6 != (GCObject *)0x0) {
    do {
      checkobject(g,pGVar6,0,0);
      incifingray((global_State *)(ulong)g->gcstate,pGVar6,&local_28);
      if ((pGVar6->marked & 0x40) == 0) {
        __assert_fail("(((o)->marked) & ((1<<(6))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x222,"int lua_checkmemory(lua_State *)");
      }
      if ((pGVar6->tt | 2) != 7) {
        __assert_fail("o->tt == 7 || o->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x223,"int lua_checkmemory(lua_State *)");
      }
      pGVar6 = pGVar6->next;
    } while (pGVar6 != (GCObject *)0x0);
  }
  if ((g->gcstate < 3) && (lVar2 != local_28)) {
    __assert_fail("totalin == totalshould",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x226,"int lua_checkmemory(lua_State *)");
  }
  return 0;
}

Assistant:

int lua_checkmemory (lua_State *L) {
  global_State *g = G(L);
  GCObject *o;
  int maybedead;
  lu_mem totalin;  /* total of objects that are in gray lists */
  lu_mem totalshould;  /* total of objects that should be in gray lists */
  if (keepinvariant(g)) {
    lua_assert(!iswhite(g->mainthread));
    lua_assert(!iswhite(gcvalue(&g->l_registry)));
  }
  lua_assert(!isdead(g, gcvalue(&g->l_registry)));
  lua_assert(g->sweepgc == NULL || issweepphase(g));
  totalin = checkgrays(g);

  /* check 'fixedgc' list */
  for (o = g->fixedgc; o != NULL; o = o->next) {
    lua_assert(o->tt == LUA_TSHRSTR && isgray(o) && getage(o) == G_OLD);
  }

  /* check 'allgc' list */
  maybedead = (GCSatomic < g->gcstate && g->gcstate <= GCSswpallgc);
  totalshould = checklist(g, maybedead, 0, g->allgc,
                             g->survival, g->old1, g->reallyold);

  /* check 'finobj' list */
  totalshould += checklist(g, 0, 1, g->finobj,
                              g->finobjsur, g->finobjold1, g->finobjrold);

  /* check 'tobefnz' list */
  for (o = g->tobefnz; o != NULL; o = o->next) {
    checkobject(g, o, 0, G_NEW);
    incifingray(g, o, &totalshould);
    lua_assert(tofinalize(o));
    lua_assert(o->tt == LUA_TUSERDATA || o->tt == LUA_TTABLE);
  }
  if (keepinvariant(g))
    lua_assert(totalin == totalshould);
  return 0;
}